

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absRpmOld.c
# Opt level: O3

Gia_Man_t * Gia_ManDupFf2In(Gia_Man_t *p,int nFlopsOld)

{
  char *pcVar1;
  Gia_Obj_t *pGVar2;
  ulong uVar3;
  int iVar4;
  Gia_Man_t *p_00;
  size_t sVar5;
  char *pcVar6;
  Gia_Obj_t *pGVar7;
  Gia_Obj_t *pGVar8;
  Vec_Int_t *pVVar9;
  uint uVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  uint uVar14;
  int iVar15;
  
  p_00 = Gia_ManStart(p->nObjs);
  pcVar1 = p->pName;
  if (pcVar1 == (char *)0x0) {
    pcVar6 = (char *)0x0;
  }
  else {
    sVar5 = strlen(pcVar1);
    pcVar6 = (char *)malloc(sVar5 + 1);
    strcpy(pcVar6,pcVar1);
  }
  p_00->pName = pcVar6;
  pcVar1 = p->pSpec;
  if (pcVar1 == (char *)0x0) {
    pcVar6 = (char *)0x0;
  }
  else {
    sVar5 = strlen(pcVar1);
    pcVar6 = (char *)malloc(sVar5 + 1);
    strcpy(pcVar6,pcVar1);
  }
  p_00->pSpec = pcVar6;
  Gia_ManFillValue(p);
  p->pObjs->Value = 0;
  iVar4 = p->nRegs;
  if (0 < iVar4) {
    iVar15 = 0;
    do {
      iVar11 = p->vCis->nSize;
      uVar10 = (iVar11 - iVar4) + iVar15;
      if (((int)uVar10 < 0) || (iVar11 <= (int)uVar10)) goto LAB_00580c64;
      iVar11 = p->vCis->pArray[uVar10];
      if (((long)iVar11 < 0) || (p->nObjs <= iVar11)) goto LAB_00580c45;
      pGVar2 = p->pObjs;
      if (pGVar2 == (Gia_Obj_t *)0x0) break;
      pGVar7 = Gia_ManAppendObj(p_00);
      uVar13 = *(ulong *)pGVar7;
      *(ulong *)pGVar7 = uVar13 | 0x9fffffff;
      *(ulong *)pGVar7 =
           uVar13 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar8 = p_00->pObjs;
      if ((pGVar7 < pGVar8) || (pGVar8 + p_00->nObjs <= pGVar7)) goto LAB_00580c26;
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar7 - (long)pGVar8) >> 2) * -0x55555555);
      pGVar8 = p_00->pObjs;
      if ((pGVar7 < pGVar8) || (pGVar8 + p_00->nObjs <= pGVar7)) goto LAB_00580c26;
      pGVar2[iVar11].Value = (int)((ulong)((long)pGVar7 - (long)pGVar8) >> 2) * 0x55555556;
      iVar15 = iVar15 + 1;
      iVar4 = p->nRegs;
    } while (iVar15 < iVar4);
  }
  iVar15 = p->vCis->nSize;
  uVar10 = iVar15 - (nFlopsOld + iVar4);
  if ((int)uVar10 < iVar15 - iVar4) {
    uVar13 = (ulong)uVar10;
    do {
      pGVar8 = Gia_ManAppendObj(p_00);
      uVar3 = *(ulong *)pGVar8;
      *(ulong *)pGVar8 = uVar3 | 0x9fffffff;
      *(ulong *)pGVar8 =
           uVar3 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20
      ;
      pGVar2 = p_00->pObjs;
      if ((pGVar8 < pGVar2) || (pGVar2 + p_00->nObjs <= pGVar8)) {
LAB_00580c26:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar8 - (long)pGVar2) >> 2) * -0x55555555);
      pGVar2 = p_00->pObjs;
      if ((pGVar8 < pGVar2) || (pGVar2 + p_00->nObjs <= pGVar8)) goto LAB_00580c26;
      iVar4 = p->nRegs;
      iVar15 = p->vCis->nSize;
      iVar11 = iVar15 - iVar4;
      if (iVar11 <= (int)uVar13) {
        __assert_fail("v < Gia_ManPiNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1a6,"Gia_Obj_t *Gia_ManPi(Gia_Man_t *, int)");
      }
      if (((int)uVar10 < 0) || (iVar15 <= (int)uVar13)) goto LAB_00580c64;
      iVar15 = p->vCis->pArray[uVar13];
      if (((long)iVar15 < 0) || (p->nObjs <= iVar15)) goto LAB_00580c45;
      p->pObjs[iVar15].Value = (int)((ulong)((long)pGVar8 - (long)pGVar2) >> 2) * 0x55555556;
      uVar13 = uVar13 + 1;
    } while ((int)uVar13 < iVar11);
  }
  pVVar9 = p->vCos;
  uVar13 = (ulong)(uint)pVVar9->nSize;
  if (iVar4 < pVVar9->nSize) {
    lVar12 = 0;
    do {
      if ((int)uVar13 <= lVar12) goto LAB_00580c64;
      iVar15 = pVVar9->pArray[lVar12];
      if (((long)iVar15 < 0) || (p->nObjs <= iVar15)) goto LAB_00580c45;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar2 = p->pObjs + iVar15;
      Gia_ManDupFf2In_rec(p_00,pGVar2 + -(ulong)((uint)*(undefined8 *)pGVar2 & 0x1fffffff));
      lVar12 = lVar12 + 1;
      iVar4 = p->nRegs;
      pVVar9 = p->vCos;
      uVar13 = (ulong)(uint)pVVar9->nSize;
    } while (lVar12 < pVVar9->nSize - iVar4);
  }
  if (iVar4 < (int)uVar13) {
    lVar12 = 0;
    do {
      if ((int)uVar13 <= lVar12) {
LAB_00580c64:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar4 = pVVar9->pArray[lVar12];
      if (((long)iVar4 < 0) || (p->nObjs <= iVar4)) {
LAB_00580c45:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar2 = p->pObjs + iVar4;
      uVar14 = (uint)*(undefined8 *)pGVar2;
      uVar10 = pGVar2[-(ulong)(uVar14 & 0x1fffffff)].Value;
      if ((int)uVar10 < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                      ,0x10f,"int Abc_LitNotCond(int, int)");
      }
      Gia_ManAppendCo(p_00,uVar14 >> 0x1d & 1 ^ uVar10);
      lVar12 = lVar12 + 1;
      pVVar9 = p->vCos;
      uVar13 = (ulong)pVVar9->nSize;
    } while (lVar12 < (long)(uVar13 - (long)p->nRegs));
  }
  Gia_ManSetRegNum(p_00,nFlopsOld);
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManDupFf2In( Gia_Man_t * p, int nFlopsOld )
{
    Gia_Man_t * pNew; 
    Gia_Obj_t * pObj;
    int i;
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManFillValue( p );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachRo( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    for ( i = Gia_ManPiNum(p) - nFlopsOld; i < Gia_ManPiNum(p); i++ )
        Gia_ManPi(p, i)->Value = Gia_ManAppendCi( pNew );
    Gia_ManForEachPo( p, pObj, i )
        Gia_ManDupFf2In_rec( pNew, Gia_ObjFanin0(pObj) );
    Gia_ManForEachPo( p, pObj, i )
        Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManSetRegNum( pNew, nFlopsOld );
    return pNew;
}